

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O1

ggml_tensor * ggml_set_f32(ggml_tensor *tensor,float value)

{
  uint *puVar1;
  ggml_type gVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  void *__s;
  ushort uVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  
  uVar21 = ggml_nrows();
  uVar22 = tensor->ne[0];
  sVar3 = tensor->nb[1];
  __s = tensor->data;
  gVar2 = tensor->type;
  iVar24 = (int)uVar22;
  iVar25 = (int)uVar21;
  switch(gVar2) {
  case GGML_TYPE_I8:
    if (0 < iVar25) {
      uVar21 = uVar21 & 0x7fffffff;
      do {
        if (0 < iVar24) {
          memset(__s,(int)value & 0xff,uVar22 & 0x7fffffff);
        }
        __s = (void *)((long)__s + sVar3);
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
    }
    break;
  case GGML_TYPE_I16:
    if (0 < iVar25) {
      auVar27 = vpbroadcastq_avx512f();
      auVar28 = vpbroadcastw_avx512bw();
      uVar22 = 0;
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        if (0 < iVar24) {
          uVar23 = 0;
          do {
            auVar33 = vpbroadcastq_avx512f();
            auVar34 = vporq_avx512f(auVar33,auVar29);
            auVar35 = vporq_avx512f(auVar33,auVar30);
            auVar36 = vporq_avx512f(auVar33,auVar31);
            auVar33 = vporq_avx512f(auVar33,auVar32);
            vpcmpuq_avx512f(auVar33,auVar27,2);
            vpcmpuq_avx512f(auVar36,auVar27,2);
            vpcmpuq_avx512f(auVar35,auVar27,2);
            vpcmpuq_avx512f(auVar34,auVar27,2);
            auVar33 = vmovdqu16_avx512bw(auVar28);
            *(undefined1 (*) [64])((long)__s + uVar23 * 2) = auVar33;
            uVar23 = uVar23 + 0x20;
          } while ((iVar24 + 0x1fU & 0xffffffe0) != uVar23);
        }
        uVar22 = uVar22 + 1;
        __s = (void *)((long)__s + sVar3);
      } while (uVar22 != (uVar21 & 0x7fffffff));
    }
    break;
  case GGML_TYPE_I32:
    if (0 < iVar25) {
      auVar27 = vpbroadcastq_avx512f();
      auVar28 = vpbroadcastd_avx512f();
      uVar22 = 0;
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        if (0 < iVar24) {
          uVar23 = 0;
          do {
            auVar31 = vpbroadcastq_avx512f();
            auVar32 = vporq_avx512f(auVar31,auVar29);
            auVar31 = vporq_avx512f(auVar31,auVar30);
            vpcmpuq_avx512f(auVar31,auVar27,2);
            vpcmpuq_avx512f(auVar32,auVar27,2);
            auVar31 = vmovdqu32_avx512f(auVar28);
            *(undefined1 (*) [64])((long)__s + uVar23 * 4) = auVar31;
            uVar23 = uVar23 + 0x10;
          } while ((iVar24 + 0xfU & 0xfffffff0) != uVar23);
        }
        uVar22 = uVar22 + 1;
        __s = (void *)((long)__s + sVar3);
      } while (uVar22 != (uVar21 & 0x7fffffff));
    }
    break;
  case GGML_TYPE_I64:
  case GGML_TYPE_F64:
  case GGML_TYPE_IQ1_M:
switchD_0010c40d_caseD_1b:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0x37b,"fatal error");
  case GGML_TYPE_BF16:
    if (0 < iVar25) {
      auVar27 = vpbroadcastq_avx512f();
      auVar28 = vpbroadcastw_avx512bw();
      uVar22 = 0;
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        if (0 < iVar24) {
          uVar23 = 0;
          do {
            auVar33 = vpbroadcastq_avx512f();
            auVar34 = vporq_avx512f(auVar33,auVar29);
            auVar35 = vporq_avx512f(auVar33,auVar30);
            auVar36 = vporq_avx512f(auVar33,auVar31);
            auVar33 = vporq_avx512f(auVar33,auVar32);
            vpcmpuq_avx512f(auVar33,auVar27,2);
            vpcmpuq_avx512f(auVar36,auVar27,2);
            vpcmpuq_avx512f(auVar35,auVar27,2);
            vpcmpuq_avx512f(auVar34,auVar27,2);
            auVar33 = vmovdqu16_avx512bw(auVar28);
            *(undefined1 (*) [64])((long)__s + uVar23 * 2) = auVar33;
            uVar23 = uVar23 + 0x20;
          } while ((iVar24 + 0x1fU & 0xffffffe0) != uVar23);
        }
        uVar22 = uVar22 + 1;
        __s = (void *)((long)__s + sVar3);
      } while (uVar22 != (uVar21 & 0x7fffffff));
    }
    break;
  default:
    if (gVar2 == GGML_TYPE_F16) {
      if (0 < iVar25) {
        auVar37._4_8_ = SUB128(ZEXT812(0),4);
        auVar37._0_4_ = value;
        auVar37._12_4_ = 0;
        auVar37 = vcvtps2ph_f16c(auVar37,0);
        auVar27 = vpbroadcastq_avx512f();
        auVar28 = vpbroadcastw_avx512bw(auVar37);
        uVar22 = 0;
        auVar29 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
        auVar30 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
        auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          if (0 < iVar24) {
            uVar23 = 0;
            do {
              auVar33 = vpbroadcastq_avx512f();
              auVar34 = vporq_avx512f(auVar33,auVar29);
              auVar35 = vporq_avx512f(auVar33,auVar30);
              auVar36 = vporq_avx512f(auVar33,auVar31);
              auVar33 = vporq_avx512f(auVar33,auVar32);
              vpcmpuq_avx512f(auVar33,auVar27,2);
              vpcmpuq_avx512f(auVar36,auVar27,2);
              vpcmpuq_avx512f(auVar35,auVar27,2);
              vpcmpuq_avx512f(auVar34,auVar27,2);
              auVar33 = vmovdqu16_avx512bw(auVar28);
              *(undefined1 (*) [64])((long)__s + uVar23 * 2) = auVar33;
              uVar23 = uVar23 + 0x20;
            } while ((iVar24 + 0x1fU & 0xffffffe0) != uVar23);
          }
          uVar22 = uVar22 + 1;
          __s = (void *)((long)__s + sVar3);
        } while (uVar22 != (uVar21 & 0x7fffffff));
      }
    }
    else {
      if (gVar2 != GGML_TYPE_F32) goto switchD_0010c40d_caseD_1b;
      if (0 < iVar25) {
        auVar27 = vpbroadcastq_avx512f();
        auVar28 = vbroadcastss_avx512f(ZEXT416((uint)value));
        uVar22 = 0;
        auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          if (0 < iVar24) {
            uVar23 = 0;
            do {
              auVar31 = vpbroadcastq_avx512f();
              auVar32 = vporq_avx512f(auVar31,auVar29);
              auVar31 = vporq_avx512f(auVar31,auVar30);
              uVar18 = vpcmpuq_avx512f(auVar31,auVar27,2);
              uVar19 = vpcmpuq_avx512f(auVar32,auVar27,2);
              bVar20 = (byte)uVar19;
              uVar26 = CONCAT11(bVar20,(byte)uVar18);
              puVar1 = (uint *)((long)__s + uVar23 * 4);
              bVar4 = (bool)((byte)uVar18 & 1);
              bVar5 = (bool)((byte)(uVar26 >> 1) & 1);
              bVar6 = (bool)((byte)(uVar26 >> 2) & 1);
              bVar7 = (bool)((byte)(uVar26 >> 3) & 1);
              bVar8 = (bool)((byte)(uVar26 >> 4) & 1);
              bVar9 = (bool)((byte)(uVar26 >> 5) & 1);
              bVar10 = (bool)((byte)(uVar26 >> 6) & 1);
              bVar11 = (bool)((byte)(uVar26 >> 7) & 1);
              bVar12 = (bool)(bVar20 >> 1 & 1);
              bVar13 = (bool)(bVar20 >> 2 & 1);
              bVar14 = (bool)(bVar20 >> 3 & 1);
              bVar15 = (bool)(bVar20 >> 4 & 1);
              bVar16 = (bool)(bVar20 >> 5 & 1);
              bVar17 = (bool)(bVar20 >> 6 & 1);
              *puVar1 = (uint)bVar4 * auVar28._0_4_ | (uint)!bVar4 * *puVar1;
              puVar1[1] = (uint)bVar5 * auVar28._4_4_ | (uint)!bVar5 * puVar1[1];
              puVar1[2] = (uint)bVar6 * auVar28._8_4_ | (uint)!bVar6 * puVar1[2];
              puVar1[3] = (uint)bVar7 * auVar28._12_4_ | (uint)!bVar7 * puVar1[3];
              puVar1[4] = (uint)bVar8 * auVar28._16_4_ | (uint)!bVar8 * puVar1[4];
              puVar1[5] = (uint)bVar9 * auVar28._20_4_ | (uint)!bVar9 * puVar1[5];
              puVar1[6] = (uint)bVar10 * auVar28._24_4_ | (uint)!bVar10 * puVar1[6];
              puVar1[7] = (uint)bVar11 * auVar28._28_4_ | (uint)!bVar11 * puVar1[7];
              puVar1[8] = (uint)(bVar20 & 1) * auVar28._32_4_ |
                          (uint)!(bool)(bVar20 & 1) * puVar1[8];
              puVar1[9] = (uint)bVar12 * auVar28._36_4_ | (uint)!bVar12 * puVar1[9];
              puVar1[10] = (uint)bVar13 * auVar28._40_4_ | (uint)!bVar13 * puVar1[10];
              puVar1[0xb] = (uint)bVar14 * auVar28._44_4_ | (uint)!bVar14 * puVar1[0xb];
              puVar1[0xc] = (uint)bVar15 * auVar28._48_4_ | (uint)!bVar15 * puVar1[0xc];
              puVar1[0xd] = (uint)bVar16 * auVar28._52_4_ | (uint)!bVar16 * puVar1[0xd];
              puVar1[0xe] = (uint)bVar17 * auVar28._56_4_ | (uint)!bVar17 * puVar1[0xe];
              puVar1[0xf] = (uint)(bVar20 >> 7) * auVar28._60_4_ |
                            (uint)!(bool)(bVar20 >> 7) * puVar1[0xf];
              uVar23 = uVar23 + 0x10;
            } while ((iVar24 + 0xfU & 0xfffffff0) != uVar23);
          }
          uVar22 = uVar22 + 1;
          __s = (void *)((long)__s + sVar3);
        } while (uVar22 != (uVar21 & 0x7fffffff));
      }
    }
  }
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_set_f32(struct ggml_tensor * tensor, float value) {
    const int n     = ggml_nrows(tensor);
    const int nc    = tensor->ne[0];
    const size_t n1 = tensor->nb[1];

    char * const data = tensor->data;

    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                assert(tensor->nb[0] == sizeof(int8_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i8(nc, (int8_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I16:
            {
                assert(tensor->nb[0] == sizeof(int16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i16(nc, (int16_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_I32:
            {
                assert(tensor->nb[0] == sizeof(int32_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_i32(nc, (int32_t *)(data + i*n1), value);
                }
            } break;
        case GGML_TYPE_F16:
            {
                assert(tensor->nb[0] == sizeof(ggml_fp16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f16(nc, (ggml_fp16_t *)(data + i*n1), GGML_FP32_TO_FP16(value));
                }
            } break;
        case GGML_TYPE_BF16:
            {
                assert(tensor->nb[0] == sizeof(ggml_bf16_t));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_bf16(nc, (ggml_bf16_t *)(data + i*n1), GGML_FP32_TO_BF16(value));
                }
            } break;
        case GGML_TYPE_F32:
            {
                assert(tensor->nb[0] == sizeof(float));
                for (int i = 0; i < n; i++) {
                    ggml_vec_set_f32(nc, (float *)(data + i*n1), value);
                }
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }

    return tensor;
}